

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffstmo(int sec,int *status)

{
  return *status;
}

Assistant:

int ffstmo(int sec, int *status)
{
   if (*status > 0)
      return (*status);

#ifdef HAVE_NET_SERVICES
   if (sec <= 0)
   {
      *status = BAD_NETTIMEOUT;
      ffpmsg("Bad value for net timeout setting (fits_set_timeout).");
      return(*status);
   }
   fits_net_timeout(sec);
#endif
   return(*status);   
}